

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Index __thiscall wasm::SIMDLoad::getMemBytes(SIMDLoad *this)

{
  SIMDLoad *this_local;
  
  switch(this->op) {
  case Load8SplatVec128:
    this_local._4_4_ = 1;
    break;
  case Load16SplatVec128:
    this_local._4_4_ = 2;
    break;
  case Load32SplatVec128:
  case Load32ZeroVec128:
    this_local._4_4_ = 4;
    break;
  case Load64SplatVec128:
  case Load8x8SVec128:
  case Load8x8UVec128:
  case Load16x4SVec128:
  case Load16x4UVec128:
  case Load32x2SVec128:
  case Load32x2UVec128:
  case Load64ZeroVec128:
    this_local._4_4_ = 8;
    break;
  default:
    handle_unreachable("unexpected op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                       ,0x1ea);
  }
  return this_local._4_4_;
}

Assistant:

Index SIMDLoad::getMemBytes() {
  switch (op) {
    case Load8SplatVec128:
      return 1;
    case Load16SplatVec128:
      return 2;
    case Load32SplatVec128:
    case Load32ZeroVec128:
      return 4;
    case Load64SplatVec128:
    case Load8x8SVec128:
    case Load8x8UVec128:
    case Load16x4SVec128:
    case Load16x4UVec128:
    case Load32x2SVec128:
    case Load32x2UVec128:
    case Load64ZeroVec128:
      return 8;
  }
  WASM_UNREACHABLE("unexpected op");
}